

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O1

void __thiscall
solitaire::SolitaireEmptyHandTest::ignoreEmptyHandPossibleOperationsTest
          (SolitaireEmptyHandTest *this)

{
  FunctionMocker<bool_()> *this_00;
  FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_01;
  FunctionMocker<unsigned_int_()> *this_02;
  StrictMock<solitaire::archivers::HistoryTrackerMock> *pSVar1;
  FoundationPileMock *mock_obj;
  TableauPileMock *pTVar2;
  element_type *peVar3;
  TypedExpectation<unsigned_int_()> *this_03;
  TypedExpectation<void_()> *pTVar4;
  TypedExpectation<std::optional<solitaire::cards::Card>_()> *pTVar5;
  TypedExpectation<bool_()> *this_04;
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *this_05;
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_06;
  Solitaire *this_07;
  FunctionMocker<std::optional<solitaire::cards::Card>_()> *pFVar6;
  FunctionMocker<void_()> *pFVar7;
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  local_78;
  PileId local_54;
  PileId local_50;
  PileId local_4c;
  MatcherBase<unsigned_int> local_48;
  
  pSVar1 = (this->super_SolitaireTest).historyTrackerMock.rawPointer;
  this_02 = &(pSVar1->super_HistoryTrackerMock).gmock10_getHistorySize_13;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_02->super_UntypedFunctionMockerBase,pSVar1);
  local_78.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)this_02;
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::MockSpec<unsigned_int_()>::InternalExpectedAt
                      ((MockSpec<unsigned_int_()> *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xaf,"*historyTrackerMock","getHistorySize()");
  testing::internal::TypedExpectation<unsigned_int_()>::Times(this_03,0);
  pSVar1 = (this->super_SolitaireTest).historyTrackerMock.rawPointer;
  pFVar7 = &(pSVar1->super_HistoryTrackerMock).gmock00_undo_12;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar7->super_UntypedFunctionMockerBase,pSVar1);
  local_78.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)pFVar7;
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                     ((MockSpec<void_()> *)&local_78,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb0,"*historyTrackerMock","undo()");
  testing::internal::TypedExpectation<void_()>::Times(pTVar4,0);
  mock_obj = (this->super_SolitaireTest).lastFoundationPileMock;
  pFVar6 = &mock_obj->gmock00_tryPullOutCard_14;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar6->super_UntypedFunctionMockerBase,mock_obj);
  local_78.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)pFVar6;
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<std::optional<solitaire::cards::Card>_()>::InternalExpectedAt
                     ((MockSpec<std::optional<solitaire::cards::Card>_()> *)&local_78,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb1,"lastFoundationPileMock","tryPullOutCard()");
  testing::internal::TypedExpectation<std::optional<solitaire::cards::Card>_()>::Times(pTVar5,0);
  pTVar2 = (this->super_SolitaireTest).lastTableauPileMock;
  this_00 = &pTVar2->gmock10_isTopCardCovered_19;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,pTVar2);
  local_78.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)this_00;
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                      ((MockSpec<bool_()> *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xb2,"lastTableauPileMock","isTopCardCovered()");
  testing::internal::TypedExpectation<bool_()>::Times(this_04,0);
  pTVar2 = (this->super_SolitaireTest).lastTableauPileMock;
  pFVar7 = &pTVar2->gmock00_tryUncoverTopCard_14;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar7->super_UntypedFunctionMockerBase,pTVar2);
  local_78.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)pFVar7;
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                     ((MockSpec<void_()> *)&local_78,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb3,"lastTableauPileMock","tryUncoverTopCard()");
  testing::internal::TypedExpectation<void_()>::Times(pTVar4,0);
  local_48.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<unsigned_int>::
       GetVTable<testing::internal::MatcherBase<unsigned_int>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0031e450;
  piles::TableauPileMock::gmock_tryPullOutCards
            (&local_78,(this->super_SolitaireTest).lastTableauPileMock,
             (Matcher<unsigned_int> *)&local_48);
  testing::internal::GetWithoutMatchers();
  this_05 = testing::internal::
            MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
            ::InternalExpectedAt
                      (&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xb4,"lastTableauPileMock","tryPullOutCards(_)");
  testing::internal::
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::Times(this_05,0);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_78.matchers_);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase(&local_48);
  peVar3 = (this->super_SolitaireTest).stockPileMock.
           super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = &peVar3->gmock10_getCards_16;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_01->super_UntypedFunctionMockerBase,peVar3);
  local_78.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)this_01;
  testing::internal::GetWithoutMatchers();
  this_06 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::InternalExpectedAt
                      ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xb5,"*stockPileMock","getCards()");
  testing::internal::
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::Times(this_06,0);
  peVar3 = (this->super_SolitaireTest).stockPileMock.
           super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pFVar7 = &peVar3->gmock00_trySelectNextCard_14;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar7->super_UntypedFunctionMockerBase,peVar3);
  local_78.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)pFVar7;
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                     ((MockSpec<void_()> *)&local_78,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb6,"*stockPileMock","trySelectNextCard()");
  testing::internal::TypedExpectation<void_()>::Times(pTVar4,0);
  peVar3 = (this->super_SolitaireTest).stockPileMock.
           super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pFVar6 = &peVar3->gmock00_tryPullOutCard_15;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar6->super_UntypedFunctionMockerBase,peVar3);
  local_78.function_mocker_ =
       (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
        *)pFVar6;
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<std::optional<solitaire::cards::Card>_()>::InternalExpectedAt
                     ((MockSpec<std::optional<solitaire::cards::Card>_()> *)&local_78,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb7,"*stockPileMock","tryPullOutCard()");
  testing::internal::TypedExpectation<std::optional<solitaire::cards::Card>_()>::Times(pTVar5,0);
  this_07 = &(this->super_SolitaireTest).solitaire;
  Solitaire::tryUndoOperation(this_07);
  local_4c.t = (anonymous_namespace)::lastFoundationPileId;
  Solitaire::tryPullOutCardFromFoundationPile(this_07,&local_4c);
  local_50.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryUncoverTableauPileTopCard(this_07,&local_50);
  local_54.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryPullOutCardsFromTableauPile(this_07,&local_54,2);
  Solitaire::trySelectNextStockPileCard(this_07);
  Solitaire::tryPullOutCardFromStockPile(this_07);
  return;
}

Assistant:

void ignoreEmptyHandPossibleOperationsTest() {
        EXPECT_CALL(*historyTrackerMock, getHistorySize()).Times(0);
        EXPECT_CALL(*historyTrackerMock, undo()).Times(0);
        EXPECT_CALL(lastFoundationPileMock, tryPullOutCard()).Times(0);
        EXPECT_CALL(lastTableauPileMock, isTopCardCovered()).Times(0);
        EXPECT_CALL(lastTableauPileMock, tryUncoverTopCard()).Times(0);
        EXPECT_CALL(lastTableauPileMock, tryPullOutCards(_)).Times(0);
        EXPECT_CALL(*stockPileMock, getCards()).Times(0);
        EXPECT_CALL(*stockPileMock, trySelectNextCard()).Times(0);
        EXPECT_CALL(*stockPileMock, tryPullOutCard()).Times(0);

        solitaire.tryUndoOperation();
        solitaire.tryPullOutCardFromFoundationPile(lastFoundationPileId);
        solitaire.tryUncoverTableauPileTopCard(lastTableauPileId);
        solitaire.tryPullOutCardsFromTableauPile(lastTableauPileId, quantityToPullOut);
        solitaire.trySelectNextStockPileCard();
        solitaire.tryPullOutCardFromStockPile();
    }